

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntScalarOrVectorType
          (ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  uint uVar2;
  uint32_t id_00;
  Instruction *pIVar3;
  bool bVar4;
  
  pIVar3 = FindDef(this,id);
  if (pIVar3 == (Instruction *)0x0) {
LAB_001ff50f:
    bVar4 = false;
  }
  else {
    uVar1 = (pIVar3->inst_).opcode;
    if (uVar1 == 0x17) {
      id_00 = GetComponentType(this,id);
      pIVar3 = FindDef(this,id_00);
      if ((pIVar3 == (Instruction *)0x0) || ((pIVar3->inst_).opcode != 0x15)) goto LAB_001ff50f;
      uVar2 = (pIVar3->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[3];
    }
    else {
      if (uVar1 != 0x15) goto LAB_001ff50f;
      uVar2 = Instruction::GetOperandAs<unsigned_int>(pIVar3,2);
    }
    bVar4 = uVar2 == 0;
  }
  return bVar4;
}

Assistant:

bool ValidationState_t::IsUnsignedIntScalarOrVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeInt) {
    return inst->GetOperandAs<uint32_t>(2) == 0;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsUnsignedIntScalarType(GetComponentType(id));
  }

  return false;
}